

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ladspa.c
# Opt level: O1

int ladspa_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  
  plVar1 = (long *)segment->data;
  lVar2 = *plVar1;
  uVar3 = *(ulong *)(lVar2 + 0x30);
  if (uVar3 != 0) {
    lVar2 = *(long *)(lVar2 + 0x38);
    uVar7 = 0;
    uVar5 = 1;
    uVar6 = 0;
    do {
      bVar4 = true;
      if ((~*(uint *)(lVar2 + uVar7 * 4) & 6) == 0) {
        if (uVar6 == field) {
          *(undefined4 *)value = *(undefined4 *)(plVar1[3] + 0xc + uVar7 * 0x10);
          bVar4 = false;
        }
        else {
          uVar6 = uVar6 + 1;
        }
      }
      if (!bVar4) {
        return 1;
      }
      uVar7 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar7 < uVar3);
  }
  mixed_err(7);
  return 0;
}

Assistant:

int ladspa_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  // I don't think the LADSPA interface is compatible with how we want
  // to use it. If I read it correctly, it says that the output controls
  // are only updated while the plugin is actually run, which is not
  // what we want here in most cases.
  struct ladspa_segment_data *data = (struct ladspa_segment_data *)segment->data;
  uint32_t index = 0;
  for(uint32_t i=0; i<data->descriptor->PortCount; ++i){
    const LADSPA_PortDescriptor port = data->descriptor->PortDescriptors[i];
    if(LADSPA_IS_PORT_CONTROL(port) && LADSPA_IS_PORT_OUTPUT(port)){
      if(index == field){
        *((float *)value) = data->ports[i].control;
        return 1;
      }
      ++index;
    }
  }
  mixed_err(MIXED_INVALID_FIELD);
  return 0;
}